

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  TestResult *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  TestPartResult *pTVar7;
  undefined8 *puVar8;
  string *value;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int iVar9;
  int i;
  _Alloc_hider _Var10;
  char *pcVar11;
  internal *this_00;
  string location;
  string message;
  string kIndent;
  string kTestsuite;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f8;
  ostream *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_40 [2];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_d8 = stream;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"testcase","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\n');
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\b');
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_d8,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"name","");
  std::__cxx11::string::string
            ((string *)&local_d0,(test_info->name_)._M_dataplus._M_p,(allocator *)local_70);
  OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"value_param","");
    pbVar2 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var10._M_p = (char *)0x0;
    }
    else {
      _Var10._M_p = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_d0,_Var10._M_p,(allocator *)local_70);
    OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar2 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"type_param","");
    pbVar2 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var10._M_p = (char *)0x0;
    }
    else {
      _Var10._M_p = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_d0,_Var10._M_p,(allocator *)local_70);
    OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"file","");
    std::__cxx11::string::string
              ((string *)&local_d0,(test_info->location_).file._M_dataplus._M_p,
               (allocator *)local_70);
    OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"line","");
    OutputJsonKey(local_d8,&local_90,&local_f8,(test_info->location_).line,&local_b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_d8,"\n",1);
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\b');
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_d8,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"status","");
    pcVar11 = "NOTRUN";
    if ((ulong)test_info->should_run_ != 0) {
      pcVar11 = "RUN";
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,pcVar11,pcVar11 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
    OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"result","");
    this = &test_info->result_;
    if (test_info->should_run_ == true) {
      bVar3 = TestResult::Skipped(this);
      pcVar11 = "COMPLETED";
      if (bVar3) {
        pcVar11 = "SKIPPED";
      }
    }
    else {
      pcVar11 = "SUPPRESSED";
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    sVar6 = strlen(pcVar11);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar11,pcVar11 + sVar6);
    OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_d0,(internal *)(test_info->result_).start_timestamp_,ms);
    OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&local_d0,(internal *)(test_info->result_).elapsed_time_,ms_00);
    OutputJsonKey(local_d8,&local_90,&local_f8,&local_d0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"classname","");
    std::__cxx11::string::string((string *)&local_d0,test_suite_name,(allocator *)local_70);
    value = &local_d0;
    OutputJsonKey(local_d8,&local_90,&local_f8,value,&local_b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    TestPropertiesAsJson(&local_f8,this,&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_d8,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(test_info->result_).test_part_results_.
                               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
      i = 0;
      iVar9 = 0;
      do {
        pTVar7 = TestResult::GetTestPartResult(this,i);
        iVar4 = (int)value;
        if (pTVar7->type_ - kNonFatalFailure < 2) {
          std::__ostream_insert<char,std::char_traits<char>>(local_d8,",\n",2);
          if (iVar9 == 0) {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_d8,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"failures",8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\": [\n",5);
          }
          this_00 = (internal *)(pTVar7->file_name_)._M_string_length;
          if (this_00 != (internal *)0x0) {
            this_00 = (internal *)(pTVar7->file_name_)._M_dataplus._M_p;
          }
          FormatCompilerIndependentFileLocation_abi_cxx11_
                    (&local_f8,this_00,(char *)(ulong)(uint)pTVar7->line_number_,iVar4);
          local_50._M_allocated_capacity = (size_type)local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_f8._M_dataplus._M_p,
                     local_f8._M_dataplus._M_p + local_f8._M_string_length);
          std::__cxx11::string::append(local_50._M_local_buf);
          puVar8 = (undefined8 *)std::__cxx11::string::append(local_50._M_local_buf);
          local_70._0_8_ = local_70 + 0x10;
          value = (string *)(puVar8 + 2);
          if ((string *)*puVar8 == value) {
            local_70._16_8_ = (value->_M_dataplus)._M_p;
            local_70._24_8_ = puVar8[3];
          }
          else {
            local_70._16_8_ = (value->_M_dataplus)._M_p;
            local_70._0_8_ = (string *)*puVar8;
          }
          local_70._8_8_ = puVar8[1];
          *puVar8 = value;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          EscapeJson(&local_d0,(string *)local_70);
          if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
          }
          if ((long *)local_50._M_allocated_capacity != local_40) {
            operator_delete((void *)local_50._M_allocated_capacity,local_40[0] + 1);
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_d8,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  {\n",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    \"failure\": \"",0x10);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",\n",3);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    \"type\": \"\"\n",0xf);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  }",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          iVar9 = iVar9 + 1;
        }
        i = i + 1;
        iVar4 = (int)((ulong)((long)(test_info->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_info->result_).test_part_results_.
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      } while (SBORROW4(i,iVar4 * -0x49249249) != i + iVar4 * 0x49249249 < 0);
      if (0 < iVar9) {
        std::__ostream_insert<char,std::char_traits<char>>(local_d8,"\n",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_d8,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_d8,"\n",1);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\b');
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_d8,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}